

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O2

void __thiscall Nes_Apu::run_until(Nes_Apu *this,cpu_time_t end_time)

{
  Nes_Square *this_00;
  Nes_Square *this_01;
  Nes_Triangle *this_02;
  Nes_Noise *this_03;
  int iVar1;
  int iVar2;
  cpu_time_t end_time_00;
  long lVar3;
  long time;
  
  time = this->last_time;
  if (end_time < time) {
    __assert_fail("( \"unmet requirement\", end_time >= last_time )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0x88,"void Nes_Apu::run_until(cpu_time_t)");
  }
  if (time != end_time) {
    this_00 = &this->square1;
    this_01 = &this->square2;
    this_02 = &this->triangle;
    this_03 = &this->noise;
    while( true ) {
      lVar3 = this->frame_delay + time;
      end_time_00 = end_time;
      if (lVar3 < end_time) {
        end_time_00 = lVar3;
      }
      this->frame_delay = ((int)time - (int)end_time_00) + this->frame_delay;
      Nes_Square::run(this_00,time,end_time_00);
      Nes_Square::run(this_01,this->last_time,end_time_00);
      Nes_Triangle::run(this_02,this->last_time,end_time_00);
      Nes_Noise::run(this_03,this->last_time,end_time_00);
      Nes_Dmc::run(&this->dmc,this->last_time,end_time_00);
      this->last_time = end_time_00;
      if (end_time <= lVar3) break;
      iVar1 = this->frame_period;
      this->frame_delay = iVar1;
      iVar2 = this->frame;
      this->frame = iVar2 + 1;
      switch(iVar2) {
      case 0:
        if ((this->frame_mode & 0xc0) == 0) {
          this->next_irq = end_time_00 + (long)iVar1 * 4 + 1;
          this->irq_flag = true;
        }
      case 2:
        Nes_Osc::clock_length((Nes_Osc *)this_00,0x20);
        Nes_Osc::clock_length((Nes_Osc *)this_01,0x20);
        Nes_Osc::clock_length((Nes_Osc *)this_03,0x20);
        Nes_Osc::clock_length(&this_02->super_Nes_Osc,0x80);
        Nes_Square::clock_sweep(this_00,-1);
        Nes_Square::clock_sweep(this_01,0);
        break;
      case 1:
        this->frame_delay = iVar1 + -2;
        break;
      case 3:
        this->frame = 0;
        if ((this->frame_mode & 0x80) != 0) {
          this->frame_delay = iVar1 * 2 + -6;
        }
      }
      Nes_Triangle::clock_linear_counter(this_02);
      Nes_Envelope::clock_envelope(&this_00->super_Nes_Envelope);
      Nes_Envelope::clock_envelope(&this_01->super_Nes_Envelope);
      Nes_Envelope::clock_envelope(&this_03->super_Nes_Envelope);
      time = this->last_time;
    }
  }
  return;
}

Assistant:

void Nes_Apu::run_until( cpu_time_t end_time )
{
	require( end_time >= last_time );
	
	if ( end_time == last_time )
		return;
	
	while ( true )
	{
		// earlier of next frame time or end time
		cpu_time_t time = last_time + frame_delay;
		if ( time > end_time )
			time = end_time;
		frame_delay -= time - last_time;
		
		// run oscs to present
		square1.run( last_time, time );
		square2.run( last_time, time );
		triangle.run( last_time, time );
		noise.run( last_time, time );
		dmc.run( last_time, time );
		last_time = time;
		
		if ( time == end_time )
			break; // no more frames to run
		
		// take frame-specific actions
		frame_delay = frame_period;
		switch ( frame++ )
		{
			case 0:
				if ( !(frame_mode & 0xc0) ) {
		 			next_irq = time + frame_period * 4 + 1;
		 			irq_flag = true;
		 		}
		 		// fall through
		 	case 2:
		 		// clock length and sweep on frames 0 and 2
				square1.clock_length( 0x20 );
				square2.clock_length( 0x20 );
				noise.clock_length( 0x20 );
				triangle.clock_length( 0x80 ); // different bit for halt flag on triangle
				
				square1.clock_sweep( -1 );
				square2.clock_sweep( 0 );
		 		break;
		 	
			case 1:
				// frame 1 is slightly shorter
				frame_delay -= 2;
				break;
			
		 	case 3:
		 		frame = 0;
		 		
		 		// frame 3 is almost twice as long in mode 1
		 		if ( frame_mode & 0x80 )
					frame_delay += frame_period - 6;
				break;
		}
		
		// clock envelopes and linear counter every frame
		triangle.clock_linear_counter();
		square1.clock_envelope();
		square2.clock_envelope();
		noise.clock_envelope();
	}
}